

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logfile_test.cpp
# Opt level: O2

int main(void)

{
  long __val;
  int iVar1;
  string str;
  string sId;
  LogFile logfile;
  
  LogFile::LogFile(&logfile);
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  for (iVar1 = -0x1a; iVar1 != 0; iVar1 = iVar1 + 1) {
    std::__cxx11::string::push_back((char)&str);
  }
  __val = 0;
  do {
    std::__cxx11::to_string(&sId,__val);
    LogFile::Append(&logfile,sId._M_dataplus._M_p,sId._M_string_length);
    LogFile::Append(&logfile," : ",3);
    LogFile::Append(&logfile,str._M_dataplus._M_p,str._M_string_length);
    LogFile::Append(&logfile,"\n",1);
    usleep(1000000);
    std::__cxx11::string::~string((string *)&sId);
    __val = __val + 1;
  } while (__val != 0xc);
  std::__cxx11::string::~string((string *)&str);
  LogFile::~LogFile(&logfile);
  return 0;
}

Assistant:

int main()
{
	LogFile logfile;
	string str;
	for (int i = 0; i < 26; ++i)
	{
		str.push_back('a' + i);
	}
	
	for (long long i = 0; i < 100000000000000000; ++i)
	{
		string sId = to_string(i);
		logfile.Append(sId.c_str(), sId.size());
		logfile.Append(" : ", 3);
		logfile.Append(str.c_str(), str.size());
		logfile.Append("\n", 1);
		usleep(1000000);
		if (10 < i)
		{
			return 0;
		}
	}
}